

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogWriter.cpp
# Opt level: O0

void xe::writeTestLog(BatchResult *result,ostream *stream)

{
  int iVar1;
  int iVar2;
  SessionInfo *info;
  TestCaseResultData *caseData_00;
  undefined1 local_30 [8];
  ConstTestCaseResultPtr caseData;
  int ndx;
  ostream *stream_local;
  BatchResult *result_local;
  
  info = BatchResult::getSessionInfo(result);
  writeSessionInfo(info,stream);
  std::operator<<(stream,"#beginSession\n");
  caseData.m_state._4_4_ = 0;
  while( true ) {
    iVar1 = caseData.m_state._4_4_;
    iVar2 = BatchResult::getNumTestCaseResults(result);
    if (iVar2 <= iVar1) break;
    BatchResult::getTestCaseResult((BatchResult *)local_30,(int)result);
    caseData_00 = de::SharedPtr<const_xe::TestCaseResultData>::operator*
                            ((SharedPtr<const_xe::TestCaseResultData> *)local_30);
    writeTestCase(caseData_00,stream);
    de::SharedPtr<const_xe::TestCaseResultData>::~SharedPtr
              ((SharedPtr<const_xe::TestCaseResultData> *)local_30);
    caseData.m_state._4_4_ = caseData.m_state._4_4_ + 1;
  }
  std::operator<<(stream,"\n#endSession\n");
  return;
}

Assistant:

void writeTestLog (const BatchResult& result, std::ostream& stream)
{
	writeSessionInfo(result.getSessionInfo(), stream);

	stream << "#beginSession\n";

	for (int ndx = 0; ndx < result.getNumTestCaseResults(); ndx++)
	{
		ConstTestCaseResultPtr caseData = result.getTestCaseResult(ndx);
		writeTestCase(*caseData, stream);
	}

	stream << "\n#endSession\n";
}